

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

char16 * __thiscall
Js::FunctionProxy::GetShortDisplayName(FunctionProxy *this,charcount_t *shortNameLength)

{
  char16 *src;
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 *puVar7;
  Recycler *this_00;
  char16 *srcName;
  uint uVar8;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  iVar4 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])();
  srcName = (char16 *)CONCAT44(extraout_var,iVar4);
  uVar5 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[8])(this);
  if (srcName == (char16 *)0x0) {
    srcName = L"";
    uVar5 = 0;
  }
  else {
    bVar2 = IsConstantFunctionName(srcName);
    if (bVar2) goto LAB_006cb318;
    uVar6 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[9])(this);
    if (uVar6 == 0) {
      bVar2 = false;
    }
    else {
      bVar2 = srcName[uVar6 - 1] == L'[';
    }
    uVar8 = uVar5 - uVar6;
    if (uVar5 < uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_013e5f18);
      *(undefined4 *)data._32_8_ = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xad5,"(nameLength >= shortNameOffset)",
                                  "nameLength >= shortNameOffset");
      if (!bVar3) goto LAB_006cb330;
      *(undefined4 *)data._32_8_ = 0;
    }
    src = srcName + uVar6;
    *shortNameLength = uVar8;
    if (!bVar2) {
      return src;
    }
    if (srcName[uVar5 - 1] != L']') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xadd,"(name[nameLength - 1] == \']\')",
                                  "name[nameLength - 1] == \']\'");
      if (!bVar2) {
LAB_006cb330:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
      uVar8 = *shortNameLength;
    }
    data.plusSize = (size_t)uVar8;
    local_70 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0xade;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (this->m_scriptContext->recycler,(TrackAllocData *)local_70);
    srcName = Memory::AllocateArray<Memory::Recycler,char16_t,false>
                        ((Memory *)this_00,(Recycler *)Memory::Recycler::AllocLeaf,0,
                         (ulong)*shortNameLength);
    js_wmemcpy_s(srcName,(ulong)*shortNameLength,src,(ulong)(*shortNameLength - 1));
    uVar5 = *shortNameLength - 1;
    srcName[uVar5] = L'\0';
  }
LAB_006cb318:
  *shortNameLength = uVar5;
  return srcName;
}

Assistant:

const char16* FunctionProxy::GetShortDisplayName(charcount_t * shortNameLength)
    {
        const char16* name = this->GetDisplayName();
        uint nameLength = this->GetDisplayNameLength();

        if (name == nullptr)
        {
            *shortNameLength = 0;
            return Constants::Empty;
        }

        if (IsConstantFunctionName(name))
        {
            *shortNameLength = nameLength;
            return name;
        }
        uint shortNameOffset = this->GetShortDisplayNameOffset();
        const char16 * shortName = name + shortNameOffset;
        bool isBracketCase = shortNameOffset != 0 && name[shortNameOffset-1] == '[';
        Assert(nameLength >= shortNameOffset);
        *shortNameLength = nameLength - shortNameOffset;

        if (!isBracketCase)
        {
            return shortName;
        }

        Assert(name[nameLength - 1] == ']');
        char16 * finalshorterName = RecyclerNewArrayLeaf(this->GetScriptContext()->GetRecycler(), char16, *shortNameLength);
        js_wmemcpy_s(finalshorterName, *shortNameLength, shortName, *shortNameLength - 1); // we don't want the last character in shorterName
        finalshorterName[*shortNameLength - 1] = _u('\0');
        *shortNameLength = *shortNameLength - 1;
        return finalshorterName;
    }